

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  pointer pcVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  size_t totalsize;
  size_t sVar11;
  ulong uVar12;
  size_t __n;
  anon_union_4_2_77b30072 flag_struct;
  Mat m;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  undefined4 local_4b0;
  uint local_4ac;
  pointer local_4a8;
  undefined8 uStack_4a0;
  undefined4 uStack_498;
  undefined4 uStack_494;
  int iStack_490;
  Allocator *local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  size_t sStack_470;
  uint local_45c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_458;
  vector<signed_char,_std::allocator<signed_char>_> local_438;
  int local_420;
  Allocator *local_418;
  int iStack_410;
  int iStack_40c;
  undefined8 local_408;
  size_t sStack_400;
  
  if (type == 1) {
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    local_420 = 1;
    local_418 = (Allocator *)0x0;
    _iStack_410 = CONCAT44(w,1);
    local_408 = 0x100000001;
    sVar11 = (size_t)w;
    sStack_400 = sVar11;
    if (w != 0) {
      local_4a8 = (pointer)0x0;
      iVar4 = posix_memalign(&local_4a8,0x10,sVar11 * 4 + 4);
      if (iVar4 != 0) {
        local_4a8 = (pointer)0x0;
      }
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_4a8;
      local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(local_4a8 + sVar11 * 2);
      (local_4a8 + sVar11 * 2)[0] = 1;
      (local_4a8 + sVar11 * 2)[1] = 0;
    }
    if (((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start == (pointer)0x0) ||
       ((long)local_408._4_4_ * sStack_400 == 0)) {
      __return_storage_ptr__->data =
           local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_0011f1af:
      __return_storage_ptr__->refcount =
           (int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      __return_storage_ptr__->elemsize =
           CONCAT44(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_,
                    local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_);
      __return_storage_ptr__->elempack = local_420;
      __return_storage_ptr__->allocator = local_418;
      __return_storage_ptr__->dims = iStack_410;
      __return_storage_ptr__->w = iStack_40c;
      __return_storage_ptr__->h = (int)local_408;
      __return_storage_ptr__->c = local_408._4_4_;
      __return_storage_ptr__->cstep = sStack_400;
      if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_finish != (pointer)0x0) {
        LOCK();
        *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
             *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                     .super__Vector_impl_data._M_finish + 1;
        UNLOCK();
      }
    }
    else {
      lVar5 = (**(code **)(*(long *)this->dr + 0x18))
                        (this->dr,local_438.
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,(long)w * 4);
      if (lVar5 == (long)w * 4) {
        __return_storage_ptr__->data =
             local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        goto LAB_0011f1af;
      }
      fprintf(_stderr,"ModelBin read weight_data failed %zd\n",lVar5);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
    }
    if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish == (pointer)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
         *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish != 0) {
      return __return_storage_ptr__;
    }
    if (local_418 != (Allocator *)0x0) {
      (**(code **)(*(long *)local_418 + 0x18))();
      return __return_storage_ptr__;
    }
LAB_0011f445:
    if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      free(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
  else {
    if (type == 0) {
      lVar5 = (**(code **)(*(long *)this->dr + 0x18))(this->dr,&local_4b0,4);
      if (lVar5 == 4) {
        if (local_4b0 != 0x2c056) {
          if (local_4b0 == 0xd4b38) {
            __n = (size_t)w;
            uVar12 = __n + 3 & 0xfffffffffffffffc;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            std::vector<signed_char,_std::allocator<signed_char>_>::resize(&local_438,uVar12);
            uVar6 = (**(code **)(*(long *)this->dr + 0x18))
                              (this->dr,local_438.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,uVar12);
            if (uVar6 == uVar12) {
              *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 0;
              __return_storage_ptr__->c = 0;
              __return_storage_ptr__->cstep = 0;
              if ((((__return_storage_ptr__->dims != 1) || (__return_storage_ptr__->w != w)) ||
                  (__return_storage_ptr__->elemsize != 1)) ||
                 ((__return_storage_ptr__->elempack != 1 ||
                  (__return_storage_ptr__->allocator != (Allocator *)0x0)))) {
                piVar2 = __return_storage_ptr__->refcount;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    if (__return_storage_ptr__->allocator == (Allocator *)0x0) {
                      if (__return_storage_ptr__->data != (void *)0x0) {
                        free(__return_storage_ptr__->data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)__return_storage_ptr__->allocator + 0x18))();
                    }
                  }
                }
                *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                __return_storage_ptr__->data = (void *)0x0;
                __return_storage_ptr__->refcount = (int *)0x0;
                __return_storage_ptr__->cstep = 0;
                __return_storage_ptr__->dims = 0;
                __return_storage_ptr__->w = 0;
                __return_storage_ptr__->h = 0;
                __return_storage_ptr__->c = 0;
                __return_storage_ptr__->elemsize = 1;
                __return_storage_ptr__->elempack = 1;
                __return_storage_ptr__->allocator = (Allocator *)0x0;
                __return_storage_ptr__->dims = 1;
                __return_storage_ptr__->w = w;
                __return_storage_ptr__->h = 1;
                __return_storage_ptr__->c = 1;
                __return_storage_ptr__->cstep = __n;
                if (w != 0) {
                  local_4a8 = (pointer)0x0;
                  iVar4 = posix_memalign(&local_4a8,0x10,uVar12 + 4);
                  if (iVar4 != 0) {
                    local_4a8 = (pointer)0x0;
                  }
                  __return_storage_ptr__->data = local_4a8;
                  __return_storage_ptr__->refcount = (int *)((long)local_4a8 + uVar12);
                  pcVar1 = (pointer)((long)local_4a8 + uVar12);
                  pcVar1[0] = '\x01';
                  pcVar1[1] = '\0';
                  pcVar1[2] = '\0';
                  pcVar1[3] = '\0';
                }
              }
              if ((__return_storage_ptr__->data != (void *)0x0) &&
                 ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
                memcpy(__return_storage_ptr__->data,
                       local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,__n);
              }
              goto LAB_0011f7cf;
            }
            pcVar7 = "ModelBin read int8_weights failed %zd\n";
          }
          else {
            if (local_4b0 != 0x1306b47) {
              uVar3 = local_4b0 >> 8;
              uVar10 = local_4b0 >> 0x10 & 0xff;
              local_4a8 = (pointer)0x0;
              uStack_4a0._0_4_ = 0;
              uStack_4a0._4_4_ = 0;
              uStack_4a0 = (pointer)0x0;
              uStack_498 = 4;
              uStack_494 = 0;
              iStack_490 = 1;
              local_488 = (Allocator *)0x0;
              uStack_480 = CONCAT44(w,1);
              local_478 = 0x100000001;
              sVar11 = (size_t)w;
              sStack_470 = sVar11;
              uVar9 = local_4b0 & 0xff;
              if (w != 0) {
                local_45c = local_4b0 & 0xff;
                local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_4ac = uVar10;
                iVar4 = posix_memalign((void **)&local_438,0x10,sVar11 * 4 + 4);
                if (iVar4 != 0) {
                  local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                }
                local_4a8 = (pointer)local_438.
                                     super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
                uStack_4a0 = (pointer)((long)local_438.
                                             super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                      sVar11 * 2 * 2);
                ((pointer)
                ((long)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + sVar11 * 2 * 2))[0] = 1;
                ((pointer)
                ((long)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + sVar11 * 2 * 2))[1] = 0;
                uVar10 = local_4ac;
                uVar9 = local_45c;
              }
              if ((local_4a8 == (pointer)0x0) || ((long)local_478._4_4_ * sStack_470 == 0)) {
                __return_storage_ptr__->data = local_4a8;
              }
              else {
                if ((uVar3 & 0xff) + uVar9 + uVar10 == 0 && local_4b0._3_1_ == '\0') {
                  if ((char)local_4b0 == '\0') {
                    lVar5 = (**(code **)(*(long *)this->dr + 0x18))(this->dr,local_4a8,(long)w * 4);
                    if (lVar5 != (long)w * 4) {
                      pcVar7 = "ModelBin read weight_data failed %zd\n";
                      goto LAB_0011f838;
                    }
                  }
                }
                else {
                  lVar5 = (**(code **)(*(long *)this->dr + 0x18))(this->dr,&local_438,0x400);
                  if (lVar5 != 0x400) {
                    pcVar7 = "ModelBin read quantization_value failed %zd\n";
LAB_0011f838:
                    fprintf(_stderr,pcVar7,lVar5);
                    __return_storage_ptr__->data = (void *)0x0;
                    __return_storage_ptr__->refcount = (int *)0x0;
                    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                    __return_storage_ptr__->allocator = (Allocator *)0x0;
                    __return_storage_ptr__->dims = 0;
                    __return_storage_ptr__->w = 0;
                    __return_storage_ptr__->h = 0;
                    __return_storage_ptr__->c = 0;
                    __return_storage_ptr__->cstep = 0;
                    goto LAB_0011f6c2;
                  }
                  uVar12 = (long)w + 3U & 0xfffffffffffffffc;
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_458,uVar12);
                  uVar6 = (**(code **)(*(long *)this->dr + 0x18))
                                    (this->dr,local_458.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start,uVar12);
                  if (uVar6 == uVar12) {
                    if (0 < w) {
                      uVar8 = 0;
                      do {
                        *(undefined4 *)(local_4a8 + uVar8 * 2) =
                             *(undefined4 *)
                              ((long)&local_438.
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                              (ulong)local_458.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar8] * 4);
                        uVar8 = uVar8 + 1;
                      } while ((uint)w != uVar8);
                    }
                  }
                  else {
                    fprintf(_stderr,"ModelBin read index_array failed %zd\n",uVar6);
                    __return_storage_ptr__->data = (void *)0x0;
                    __return_storage_ptr__->refcount = (int *)0x0;
                    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
                    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
                    __return_storage_ptr__->allocator = (Allocator *)0x0;
                    __return_storage_ptr__->dims = 0;
                    __return_storage_ptr__->w = 0;
                    __return_storage_ptr__->h = 0;
                    __return_storage_ptr__->c = 0;
                    __return_storage_ptr__->cstep = 0;
                  }
                  if (local_458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_458.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_458.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_458.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (uVar6 != uVar12) goto LAB_0011f6c2;
                }
                __return_storage_ptr__->data = local_4a8;
              }
              __return_storage_ptr__->refcount = (int *)uStack_4a0;
              __return_storage_ptr__->elemsize = CONCAT44(uStack_494,uStack_498);
              __return_storage_ptr__->elempack = iStack_490;
              __return_storage_ptr__->allocator = local_488;
              __return_storage_ptr__->dims = (undefined4)uStack_480;
              __return_storage_ptr__->w = uStack_480._4_4_;
              __return_storage_ptr__->h = (undefined4)local_478;
              __return_storage_ptr__->c = local_478._4_4_;
              __return_storage_ptr__->cstep = sStack_470;
              if (uStack_4a0 != (pointer)0x0) {
                LOCK();
                *(int *)uStack_4a0 = *(int *)uStack_4a0 + 1;
                UNLOCK();
              }
LAB_0011f6c2:
              if (uStack_4a0 == (pointer)0x0) {
                return __return_storage_ptr__;
              }
              LOCK();
              *(int *)uStack_4a0 = *(int *)uStack_4a0 + -1;
              UNLOCK();
              if (*(int *)uStack_4a0 != 0) {
                return __return_storage_ptr__;
              }
              if (local_488 != (Allocator *)0x0) {
                (**(code **)(*(long *)local_488 + 0x18))();
                return __return_storage_ptr__;
              }
              if (local_4a8 == (pointer)0x0) {
                return __return_storage_ptr__;
              }
              free(local_4a8);
              return __return_storage_ptr__;
            }
            uVar12 = (long)w * 2 + 3U & 0xfffffffffffffffc;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_438,uVar12)
            ;
            uVar6 = (**(code **)(*(long *)this->dr + 0x18))
                              (this->dr,local_438.
                                        super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,uVar12);
            if (uVar6 == uVar12) {
              Mat::from_float16(__return_storage_ptr__,
                                (unsigned_short *)
                                local_438.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,w);
              goto LAB_0011f7cf;
            }
            pcVar7 = "ModelBin read float16_weights failed %zd\n";
          }
          fprintf(_stderr,pcVar7,uVar6);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
LAB_0011f7cf:
          if ((unsigned_short *)
              local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start == (unsigned_short *)0x0) {
            return __return_storage_ptr__;
          }
          operator_delete(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          CONCAT44(local_438.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   local_438.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                          (long)local_438.
                                super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          return __return_storage_ptr__;
        }
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        local_420 = 1;
        local_418 = (Allocator *)0x0;
        _iStack_410 = CONCAT44(w,1);
        local_408 = 0x100000001;
        sVar11 = (size_t)w;
        sStack_400 = sVar11;
        if (w != 0) {
          local_4a8 = (pointer)0x0;
          iVar4 = posix_memalign(&local_4a8,0x10,sVar11 * 4 + 4);
          if (iVar4 != 0) {
            local_4a8 = (pointer)0x0;
          }
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_4a8;
          local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)(local_4a8 + sVar11 * 2);
          (local_4a8 + sVar11 * 2)[0] = 1;
          (local_4a8 + sVar11 * 2)[1] = 0;
        }
        if (((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) ||
           ((long)local_408._4_4_ * sStack_400 == 0)) {
          __return_storage_ptr__->data =
               local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_0011f3c8:
          __return_storage_ptr__->refcount =
               (int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          __return_storage_ptr__->elemsize =
               CONCAT44(local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
          __return_storage_ptr__->elempack = local_420;
          __return_storage_ptr__->allocator = local_418;
          __return_storage_ptr__->dims = iStack_410;
          __return_storage_ptr__->w = iStack_40c;
          __return_storage_ptr__->h = (int)local_408;
          __return_storage_ptr__->c = local_408._4_4_;
          __return_storage_ptr__->cstep = sStack_400;
          if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                 *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
            UNLOCK();
          }
        }
        else {
          lVar5 = (**(code **)(*(long *)this->dr + 0x18))
                            (this->dr,local_438.
                                      super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,(long)w * 4);
          if (lVar5 == (long)w * 4) {
            __return_storage_ptr__->data =
                 local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            goto LAB_0011f3c8;
          }
          fprintf(_stderr,"ModelBin read weight_data failed %zd\n",lVar5);
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->c = 0;
          __return_storage_ptr__->cstep = 0;
        }
        if ((pointer)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                     .super__Vector_impl_data._M_finish == (pointer)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
             *(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                     .super__Vector_impl_data._M_finish + -1;
        UNLOCK();
        if (*(int *)local_438.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish != 0) {
          return __return_storage_ptr__;
        }
        if (local_418 != (Allocator *)0x0) {
          (**(code **)(*(long *)local_418 + 0x18))();
          return __return_storage_ptr__;
        }
        goto LAB_0011f445;
      }
      fprintf(_stderr,"ModelBin read flag_struct failed %zd\n",lVar5);
    }
    else {
      fprintf(_stderr,"ModelBin load type %d not implemented\n",(ulong)(uint)type);
    }
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            fprintf(stderr, "ModelBin read flag_struct failed %zd\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %zd\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %zd\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %zd\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                fprintf(stderr, "ModelBin read quantization_value failed %zd\n", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                fprintf(stderr, "ModelBin read index_array failed %zd\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %zd\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        size_t nread = dr.read(m, w * sizeof(float));
        if (nread != w * sizeof(float))
        {
            fprintf(stderr, "ModelBin read weight_data failed %zd\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}